

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O0

int dsa_pub_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  UniquePtr<DSA> cbs;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  DSA *__p;
  DSA *__p_00;
  BIGNUM *pBVar4;
  pointer pdVar5;
  unique_ptr<dsa_st,_bssl::internal::Deleter> local_30;
  UniquePtr<DSA> dsa;
  CBS *key_local;
  CBS *params_local;
  EVP_PKEY *out_local;
  
  dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)key;
  std::unique_ptr<dsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<dsa_st,bssl::internal::Deleter> *)&local_30);
  sVar3 = CBS_len(params);
  if (sVar3 == 0) {
    __p = DSA_new();
    std::unique_ptr<dsa_st,_bssl::internal::Deleter>::reset(&local_30,(pointer)__p);
    bVar1 = std::operator==(&local_30,(nullptr_t)0x0);
    if (bVar1) {
      out_local._4_4_ = 0;
      goto LAB_0020fee5;
    }
  }
  else {
    __p_00 = DSA_parse_parameters(params);
    std::unique_ptr<dsa_st,_bssl::internal::Deleter>::reset(&local_30,__p_00);
    bVar1 = std::operator==(&local_30,(nullptr_t)0x0);
    if ((bVar1) || (sVar3 = CBS_len(params), sVar3 != 0)) {
      ERR_put_error(6,0,0x66,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                    ,0x28);
      out_local._4_4_ = 0;
      goto LAB_0020fee5;
    }
  }
  pBVar4 = BN_new();
  pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
  pdVar5->pub_key = (BIGNUM *)pBVar4;
  pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
  cbs = dsa;
  if (pdVar5->pub_key == (BIGNUM *)0x0) {
    out_local._4_4_ = 0;
  }
  else {
    pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_30);
    iVar2 = BN_parse_asn1_unsigned
                      ((CBS *)cbs._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl,pdVar5->pub_key);
    if ((iVar2 == 0) ||
       (sVar3 = CBS_len((CBS *)dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl), sVar3 != 0)) {
      ERR_put_error(6,0,0x66,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                    ,0x33);
      out_local._4_4_ = 0;
    }
    else {
      pdVar5 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::release(&local_30);
      EVP_PKEY_assign_DSA(out,pdVar5);
      out_local._4_4_ = 1;
    }
  }
LAB_0020fee5:
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return out_local._4_4_;
}

Assistant:

static int dsa_pub_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 3279, section 2.3.2.

  // Parameters may or may not be present.
  bssl::UniquePtr<DSA> dsa;
  if (CBS_len(params) == 0) {
    dsa.reset(DSA_new());
    if (dsa == nullptr) {
      return 0;
    }
  } else {
    dsa.reset(DSA_parse_parameters(params));
    if (dsa == nullptr || CBS_len(params) != 0) {
      OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
      return 0;
    }
  }

  dsa->pub_key = BN_new();
  if (dsa->pub_key == nullptr) {
    return 0;
  }

  if (!BN_parse_asn1_unsigned(key, dsa->pub_key) || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  EVP_PKEY_assign_DSA(out, dsa.release());
  return 1;
}